

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O3

void * utf8cpy(void *dst,void *src)

{
  void *pvVar1;
  char cVar2;
  char *s;
  char *pcVar3;
  char *d;
  
  pvVar1 = dst;
  cVar2 = *src;
  if (cVar2 != '\0') {
    pcVar3 = (char *)((long)src + 1);
    do {
      *(char *)dst = cVar2;
      dst = (void *)((long)dst + 1);
      cVar2 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar2 != '\0');
  }
  *(char *)dst = '\0';
  return pvVar1;
}

Assistant:

void *utf8cpy(void *dst, const void *src) {
  char *d = (char *)dst;
  const char *s = (const char *)src;

  // overwriting anything previously in dst, write byte-by-byte
  // from src
  while ('\0' != *s) {
    *d++ = *s++;
  }

  // append null terminating byte
  *d = '\0';

  return dst;
}